

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::WriteTargetClean(cmGlobalNinjaGenerator *this,ostream *os)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  mapped_type *pmVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _Base_ptr p_Var6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  string *psVar7;
  mapped_type *pmVar8;
  pointer pbVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer pbVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  string_view separator;
  string local_2f8;
  string local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b8;
  allocator<char> local_2ab;
  allocator<char> local_2aa;
  allocator<char> local_2a9;
  string local_2a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  string local_270;
  ostream *local_250;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  byproducts;
  string local_218;
  cmNinjaRule rule;
  string local_d0;
  string local_b0;
  key_type local_90;
  string local_70;
  string local_50;
  
  local_250 = os;
  bVar2 = WriteTargetCleanAdditional(this,os);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CLEAN",(allocator<char> *)&local_2f8);
  cmNinjaRule::cmNinjaRule(&rule,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  NinjaCmd_abi_cxx11_(&local_2d8,this);
  cmStrCat<std::__cxx11::string,char_const(&)[29]>
            (&local_2f8,&local_2d8,(char (*) [29])" $FILE_ARG -t clean $TARGETS");
  std::__cxx11::string::operator=((string *)&rule.Command,(string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::assign((char *)&rule.Description);
  std::__cxx11::string::assign((char *)&rule.Comment);
  WriteRule((ostream *)
            (this->RulesFileStream)._M_t.
            super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
            .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,&rule);
  cmNinjaRule::~cmNinjaRule(&rule);
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            (&configs,(cmMakefile *)
                      (((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
                        super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                      super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t,
             IncludeEmptyConfig);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"CLEAN",(allocator<char> *)&local_2f8);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)&rule,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::assign((char *)&rule);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&rule.Description);
  pbVar10 = configs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar9 = configs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pbVar9 == pbVar10) break;
    local_2b8 = pbVar9;
    iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x25])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,(char *)CONCAT44(extraout_var,iVar4),
               (allocator<char> *)&local_270);
    NinjaOutputPath(&local_2d8,this,&local_2a8);
    (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4c])
              (&local_2f8,this,&local_2d8);
    std::__cxx11::string::operator=
              ((string *)rule.Description._M_dataplus._M_p,(string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2a8);
    iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x28])(this);
    if ((char)iVar4 != '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,"CMakeFiles/cmake_byproducts_for_clean_target",&local_2a9);
      NinjaOutputPath(&local_2a8,this,&local_270);
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4c])
                (&local_2d8,this,&local_2a8,local_2b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_218,"CMakeFiles/cmake_byproducts_for_clean_target",&local_2aa);
      NinjaOutputPath((string *)&byproducts,this,&local_218);
      cmStrCat<std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
                (&local_2f8,&local_2d8,(char (*) [2])0x6f1305,(string *)&byproducts);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"TARGETS",&local_2ab);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&rule.RspFile.field_2,&local_90);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&byproducts);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_270);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&rule.DepFile._M_string_length);
    __lhs = configs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = configs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a8,"CMakeFiles/clean.additional",(allocator<char> *)&local_270);
      NinjaOutputPath(&local_2d8,this,&local_2a8);
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4c])
                (&local_2f8,this,&local_2d8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &rule.DepFile._M_string_length,&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2a8);
      __lhs = configs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = configs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; __lhs != pbVar1; __lhs = __lhs + 1) {
      bVar3 = std::operator!=(__lhs,local_2b8);
      if ((!bVar3) || ((this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0))
      {
        iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                  _vptr_cmGlobalGenerator[0x28])(this);
        if ((char)iVar4 != '\0') {
          cmGlobalNinjaMultiGenerator::GetNinjaImplFilename(&local_2a8,__lhs);
          NinjaOutputPath(&local_2d8,this,&local_2a8);
          cmStrCat<char_const(&)[4],std::__cxx11::string>
                    (&local_2f8,(char (*) [4])0x711f1d,&local_2d8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_270,"FILE_ARG",(allocator<char> *)&byproducts);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&rule.RspFile.field_2,&local_270);
          std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_2f8);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::__cxx11::string::~string((string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_2a8);
        }
        iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                  _vptr_cmGlobalGenerator[0x45])(this,__lhs);
        WriteBuild(this,(ostream *)CONCAT44(extraout_var_00,iVar4),(cmNinjaBuild *)&rule,0,
                   (bool *)0x0);
      }
    }
    pbVar9 = local_2b8 + 1;
  }
  if ((this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x25])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,(char *)CONCAT44(extraout_var_01,iVar4),
               (allocator<char> *)&byproducts);
    NinjaOutputPath(&local_2d8,this,&local_2a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"all",(allocator<char> *)&local_218);
    (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4c])
              (&local_2f8,this,&local_2d8,&local_270);
    std::__cxx11::string::operator=
              ((string *)rule.Description._M_dataplus._M_p,(string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&rule.DepFile._M_string_length);
    if (bVar2) {
      for (p_Var6 = (this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &(this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a8,"CMakeFiles/clean.additional",(allocator<char> *)&local_270)
        ;
        NinjaOutputPath(&local_2d8,this,&local_2a8);
        (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
          [0x4c])(&local_2f8,this,&local_2d8,p_Var6 + 1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &rule.DepFile._M_string_length,&local_2f8);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_2a8);
      }
    }
    byproducts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    byproducts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    byproducts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&byproducts,(this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    for (p_Var6 = (this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a8,"CMakeFiles/cmake_byproducts_for_clean_target",
                 (allocator<char> *)&local_270);
      NinjaOutputPath(&local_2d8,this,&local_2a8);
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4c])
                (&local_2f8,this,&local_2d8,p_Var6 + 1);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&byproducts,
                 &local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2a8);
    }
    local_2f8._M_dataplus._M_p = "CMakeFiles/cmake_byproducts_for_clean_target";
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&byproducts,
               (char **)&local_2f8);
    separator._M_str = " ";
    separator._M_len = 1;
    cmJoin(&local_2f8,&byproducts,separator,(string_view)ZEXT816(0));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,"TARGETS",(allocator<char> *)&local_2a8);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&rule.RspFile.field_2,&local_2d8);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2f8);
    local_2b8 = configs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar10 = configs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar10 != local_2b8;
        pbVar10 = pbVar10 + 1) {
      cmGlobalNinjaMultiGenerator::GetNinjaImplFilename(&local_2a8,pbVar10);
      NinjaOutputPath(&local_2d8,this,&local_2a8);
      cmStrCat<char_const(&)[4],std::__cxx11::string>(&local_2f8,(char (*) [4])0x711f1d,&local_2d8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,"FILE_ARG",(allocator<char> *)&local_218);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&rule.RspFile.field_2,&local_270);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2a8);
      iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                _vptr_cmGlobalGenerator[0x45])(this,pbVar10);
      WriteBuild(this,(ostream *)CONCAT44(extraout_var_02,iVar4),(cmNinjaBuild *)&rule,0,(bool *)0x0
                );
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&byproducts);
  }
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)&rule);
  iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x28])(this);
  if ((char)iVar4 != '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"phony",(allocator<char> *)&local_2f8);
    cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)&rule,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x25])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,(char *)CONCAT44(extraout_var_03,iVar4),
               (allocator<char> *)&local_2a8);
    NinjaOutputPath(&local_2f8,this,&local_2d8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &rule.Description,&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&rule.DepFile._M_string_length);
    pbVar10 = configs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar9 = configs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar10; pbVar9 = pbVar9 + 1)
    {
      iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                _vptr_cmGlobalGenerator[0x25])(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a8,(char *)CONCAT44(extraout_var_04,iVar4),
                 (allocator<char> *)&local_270);
      NinjaOutputPath(&local_2d8,this,&local_2a8);
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4c])
                (&local_2f8,this,&local_2d8);
      std::__cxx11::string::operator=((string *)rule.DepFile._M_string_length,(string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2a8);
      iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                _vptr_cmGlobalGenerator[0x46])(this,pbVar9);
      WriteBuild(this,(ostream *)CONCAT44(extraout_var_05,iVar4),(cmNinjaBuild *)&rule,0,(bool *)0x0
                );
    }
    if ((this->DefaultConfigs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&rule.DepFile._M_string_length);
      for (p_Var6 = (this->DefaultConfigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &(this->DefaultConfigs)._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                  _vptr_cmGlobalGenerator[0x25])(this);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a8,(char *)CONCAT44(extraout_var_06,iVar4),
                   (allocator<char> *)&local_270);
        NinjaOutputPath(&local_2d8,this,&local_2a8);
        (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
          [0x4c])(&local_2f8,this,&local_2d8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &rule.DepFile._M_string_length,&local_2f8);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_2a8);
      }
      iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                _vptr_cmGlobalGenerator[0x47])(this);
      WriteBuild(this,(ostream *)CONCAT44(extraout_var_07,iVar4),(cmNinjaBuild *)&rule,0,(bool *)0x0
                );
    }
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)&rule);
  }
  iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x28])(this);
  if ((char)iVar4 != '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"phony",(allocator<char> *)&local_2f8);
    cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)&rule,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::assign((char *)&rule);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,"CMakeFiles/cmake_byproducts_for_clean_target",
               (allocator<char> *)&local_2d8);
    psVar7 = ConvertToNinjaPath(this,&local_2f8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &rule.Description,psVar7);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&rule.DepFile._M_string_length,&this->ByproductsForCleanTarget);
    WriteBuild(this,local_250,(cmNinjaBuild *)&rule,0,(bool *)0x0);
    for (; configs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           configs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
        configs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             configs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d8,"CMakeFiles/cmake_byproducts_for_clean_target",
                 (allocator<char> *)&local_2a8);
      psVar7 = ConvertToNinjaPath(this,&local_2d8);
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4c])
                (&local_2f8,this,psVar7);
      std::__cxx11::string::operator=
                ((string *)rule.Description._M_dataplus._M_p,(string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2d8);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
               ::operator[](&this->Configs,
                            configs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&rule.DepFile._M_string_length,&pmVar8->ByproductsForCleanTarget);
      WriteBuild(this,local_250,(cmNinjaBuild *)&rule,0,(bool *)0x0);
    }
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)&rule);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configs);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteTargetClean(std::ostream& os)
{
  // -- Additional clean target
  bool additionalFiles = this->WriteTargetCleanAdditional(os);

  // -- Default clean target
  // Write rule
  {
    cmNinjaRule rule("CLEAN");
    rule.Command = cmStrCat(this->NinjaCmd(), " $FILE_ARG -t clean $TARGETS");
    rule.Description = "Cleaning all built files...";
    rule.Comment = "Rule for cleaning all built files.";
    WriteRule(*this->RulesFileStream, rule);
  }

  auto const configs = this->Makefiles.front()->GetGeneratorConfigs(
    cmMakefile::IncludeEmptyConfig);

  // Write build
  {
    cmNinjaBuild build("CLEAN");
    build.Comment = "Clean all the built files.";
    build.Outputs.emplace_back();

    for (auto const& config : configs) {
      build.Outputs.front() = this->BuildAlias(
        this->NinjaOutputPath(this->GetCleanTargetName()), config);
      if (this->IsMultiConfig()) {
        build.Variables["TARGETS"] = cmStrCat(
          this->BuildAlias(
            this->NinjaOutputPath(GetByproductsForCleanTargetName()), config),
          " ", this->NinjaOutputPath(GetByproductsForCleanTargetName()));
      }
      build.ExplicitDeps.clear();
      if (additionalFiles) {
        build.ExplicitDeps.push_back(this->BuildAlias(
          this->NinjaOutputPath(this->GetAdditionalCleanTargetName()),
          config));
      }
      for (auto const& fileConfig : configs) {
        if (fileConfig != config && !this->EnableCrossConfigBuild()) {
          continue;
        }
        if (this->IsMultiConfig()) {
          build.Variables["FILE_ARG"] = cmStrCat(
            "-f ",
            this->NinjaOutputPath(
              cmGlobalNinjaMultiGenerator::GetNinjaImplFilename(fileConfig)));
        }
        this->WriteBuild(*this->GetImplFileStream(fileConfig), build);
      }
    }

    if (this->EnableCrossConfigBuild()) {
      build.Outputs.front() = this->BuildAlias(
        this->NinjaOutputPath(this->GetCleanTargetName()), "all");
      build.ExplicitDeps.clear();

      if (additionalFiles) {
        for (auto const& config : this->CrossConfigs) {
          build.ExplicitDeps.push_back(this->BuildAlias(
            this->NinjaOutputPath(this->GetAdditionalCleanTargetName()),
            config));
        }
      }

      std::vector<std::string> byproducts;
      byproducts.reserve(this->CrossConfigs.size());
      for (auto const& config : this->CrossConfigs) {
        byproducts.push_back(this->BuildAlias(
          this->NinjaOutputPath(GetByproductsForCleanTargetName()), config));
      }
      byproducts.emplace_back(GetByproductsForCleanTargetName());
      build.Variables["TARGETS"] = cmJoin(byproducts, " ");

      for (auto const& fileConfig : configs) {
        build.Variables["FILE_ARG"] = cmStrCat(
          "-f ",
          this->NinjaOutputPath(
            cmGlobalNinjaMultiGenerator::GetNinjaImplFilename(fileConfig)));
        this->WriteBuild(*this->GetImplFileStream(fileConfig), build);
      }
    }
  }

  if (this->IsMultiConfig()) {
    cmNinjaBuild build("phony");
    build.Outputs.emplace_back(
      this->NinjaOutputPath(this->GetCleanTargetName()));
    build.ExplicitDeps.emplace_back();

    for (auto const& config : configs) {
      build.ExplicitDeps.front() = this->BuildAlias(
        this->NinjaOutputPath(this->GetCleanTargetName()), config);
      this->WriteBuild(*this->GetConfigFileStream(config), build);
    }

    if (!this->DefaultConfigs.empty()) {
      build.ExplicitDeps.clear();
      for (auto const& config : this->DefaultConfigs) {
        build.ExplicitDeps.push_back(this->BuildAlias(
          this->NinjaOutputPath(this->GetCleanTargetName()), config));
      }
      this->WriteBuild(*this->GetDefaultFileStream(), build);
    }
  }

  // Write byproducts
  if (this->IsMultiConfig()) {
    cmNinjaBuild build("phony");
    build.Comment = "Clean byproducts.";
    build.Outputs.emplace_back(
      this->ConvertToNinjaPath(GetByproductsForCleanTargetName()));
    build.ExplicitDeps = this->ByproductsForCleanTarget;
    this->WriteBuild(os, build);

    for (auto const& config : configs) {
      build.Outputs.front() = this->BuildAlias(
        this->ConvertToNinjaPath(GetByproductsForCleanTargetName()), config);
      build.ExplicitDeps = this->Configs[config].ByproductsForCleanTarget;
      this->WriteBuild(os, build);
    }
  }
}